

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.h
# Opt level: O0

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SPxSteepPR(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,char *name,Setup mode)

{
  undefined4 in_EDX;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  nullptr_t in_stack_ffffffffffffff38;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 in_stack_ffffffffffffff48;
  int n;
  pointer *val;
  cpp_dec_float<50U,_int,_void> *this_00;
  char *in_stack_ffffffffffffff58;
  int n_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffff68;
  int iVar3;
  undefined8 local_70;
  undefined1 local_68 [52];
  undefined4 local_34;
  undefined8 local_20;
  undefined8 *local_18;
  bool *local_10;
  undefined8 *local_8;
  
  n = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_34 = in_EDX;
  SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxPricer((SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
              in_stack_ffffffffffffff58);
  (in_RDI->super_IdxSet)._vptr_IdxSet = (_func_int **)&PTR_getName_004ef918;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(in_RDI,iVar3,
                 (shared_ptr<soplex::Tolerances> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x235100);
  n_00 = (int)((ulong)&in_RDI[2].super_IdxSet.freeArray >> 0x20);
  uVar2 = 0;
  iVar3 = (int)((ulong)local_68 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(in_RDI,iVar3,
                 (shared_ptr<soplex::Tolerances> *)CONCAT44(uVar2,in_stack_ffffffffffffff60));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x235146);
  this_00 = (cpp_dec_float<50U,_int,_void> *)&in_RDI[3].super_IdxSet.freeArray;
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::Array((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
           *)this_00,n);
  val = &in_RDI[3].
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
  ::Array((Array<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>
           *)this_00,(int)((ulong)val >> 0x20));
  p_Var1 = &in_RDI[3]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  DIdxSet::DIdxSet((DIdxSet *)CONCAT44(uVar2,in_stack_ffffffffffffff60),n_00);
  DIdxSet::DIdxSet((DIdxSet *)CONCAT44(uVar2,in_stack_ffffffffffffff60),n_00);
  local_10 = &in_RDI[4].setupStatus;
  local_70 = 0x3ff0000000000000;
  local_18 = &local_70;
  local_20 = 0;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (this_00,(double)val,p_Var1);
  *(undefined4 *)
   &in_RDI[5].
    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_34;
  *(undefined1 *)
   ((long)&in_RDI[5].
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  return;
}

Assistant:

SPxSteepPR(const char* name = "Steep", Setup mode = DEFAULT)
      : SPxPricer<R>(name)
      , workVec(0, nullptr)
      , workRhs(0, nullptr)
      , pi_p(1.0)
      , setup(mode)
      , refined(false)
   {
      assert(isConsistent());
   }